

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_diag_sse41_128_16.c
# Opt level: O3

parasail_result_t *
parasail_nw_table_diag_sse41_128_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  ulong uVar1;
  int *piVar2;
  int *piVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  int iVar10;
  short sVar11;
  undefined1 auVar12 [16];
  unkbyte10 Var13;
  undefined1 auVar14 [16];
  int iVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  parasail_result_t *ppVar19;
  int16_t *ptr;
  int16_t *ptr_00;
  int16_t *ptr_01;
  int16_t *ptr_02;
  long lVar20;
  short sVar21;
  uint uVar22;
  int iVar23;
  ulong uVar24;
  int16_t iVar25;
  int iVar26;
  ulong uVar27;
  uint uVar28;
  undefined8 unaff_RBX;
  ulong uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  ulong uVar35;
  ulong uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  short sVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  short sVar47;
  undefined1 auVar46 [16];
  undefined4 uVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  ushort uVar56;
  ushort uVar57;
  ushort uVar58;
  ushort uVar59;
  undefined1 auVar60 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar61 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  ushort uVar64;
  ushort uVar67;
  ushort uVar68;
  ushort uVar69;
  ushort uVar70;
  ushort uVar71;
  ushort uVar72;
  ushort uVar73;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar74 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  uint local_1b0;
  short local_198;
  short sStack_196;
  undefined1 local_158 [16];
  long local_140;
  long local_138;
  long local_130;
  long local_128;
  long local_120;
  long local_118;
  long local_110;
  long local_108;
  ushort local_f8;
  ushort uStack_f6;
  undefined8 local_98;
  ulong uStack_90;
  short local_78;
  short sStack_76;
  short sStack_74;
  short sStack_72;
  short sStack_70;
  short sStack_6e;
  short sStack_6c;
  short sStack_6a;
  short local_68;
  short sStack_66;
  short sStack_64;
  short sStack_62;
  short sStack_60;
  short sStack_5e;
  short sStack_5c;
  short sStack_5a;
  short sVar75;
  short sVar79;
  
  if (_s2 == (char *)0x0) {
    parasail_nw_table_diag_sse41_128_16_cold_7();
  }
  else if (s2Len < 1) {
    parasail_nw_table_diag_sse41_128_16_cold_6();
  }
  else if (open < 0) {
    parasail_nw_table_diag_sse41_128_16_cold_5();
  }
  else if (gap < 0) {
    parasail_nw_table_diag_sse41_128_16_cold_4();
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    parasail_nw_table_diag_sse41_128_16_cold_3();
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        parasail_nw_table_diag_sse41_128_16_cold_2();
        return (parasail_result_t *)0x0;
      }
      if (_s1Len < 1) {
        parasail_nw_table_diag_sse41_128_16_cold_1();
        return (parasail_result_t *)0x0;
      }
    }
    else {
      _s1Len = matrix->length;
    }
    iVar26 = -open;
    iVar23 = matrix->min;
    iVar18 = -iVar23;
    if (iVar23 != iVar26 && SBORROW4(iVar23,iVar26) == iVar23 + open < 0) {
      iVar18 = open;
    }
    iVar23 = matrix->max;
    ppVar19 = parasail_result_new_table1(_s1Len,s2Len);
    if (ppVar19 != (parasail_result_t *)0x0) {
      ppVar19->flag = ppVar19->flag | 0x8221001;
      uVar24 = (ulong)(s2Len + 0xe);
      ptr = parasail_memalign_int16_t(0x10,uVar24);
      ptr_00 = parasail_memalign_int16_t(0x10,uVar24);
      ptr_01 = parasail_memalign_int16_t(0x10,uVar24);
      if (ptr_01 != (int16_t *)0x0 && (ptr_00 != (int16_t *)0x0 && ptr != (int16_t *)0x0)) {
        if (matrix->type == 0) {
          iVar15 = _s1Len + 7;
          ptr_02 = parasail_memalign_int16_t(0x10,(long)iVar15);
          if (ptr_02 == (int16_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          if (0 < _s1Len) {
            piVar2 = matrix->mapper;
            uVar24 = 0;
            do {
              ptr_02[uVar24] = (int16_t)piVar2[(byte)_s1[uVar24]];
              uVar24 = uVar24 + 1;
            } while ((uint)_s1Len != uVar24);
          }
          iVar10 = _s1Len + 1U;
          if ((int)(_s1Len + 1U) < iVar15) {
            iVar10 = iVar15;
          }
          memset(ptr_02 + _s1Len,0,(ulong)(uint)(~_s1Len + iVar10) * 2 + 2);
        }
        else {
          ptr_02 = (int16_t *)0x0;
        }
        auVar39 = ZEXT416((uint)CONCAT62((int6)((ulong)unaff_RBX >> 0x10),0x7ffe - (short)iVar23));
        sVar11 = (short)gap;
        sVar21 = (short)iVar26;
        sVar4 = (short)open;
        uVar28 = s2Len + 7;
        local_1b0 = _s1Len - 1;
        iVar23 = s2Len + -1;
        uVar30 = iVar18 - 0x7fff;
        auVar49 = pshuflw(ZEXT416(uVar30),ZEXT416(uVar30),0);
        uVar48 = auVar49._0_4_;
        local_198 = auVar49._0_2_;
        sStack_196 = auVar49._2_2_;
        auVar39 = pshuflw(auVar39,auVar39,0);
        auVar49._0_4_ = auVar39._0_4_;
        auVar49._4_4_ = auVar49._0_4_;
        auVar49._8_4_ = auVar49._0_4_;
        auVar49._12_4_ = auVar49._0_4_;
        auVar49 = pshuflw(auVar49,ZEXT416((uint)open),0);
        uVar37 = auVar49._0_4_;
        auVar49 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
        uVar38 = auVar49._0_4_;
        auVar50._4_4_ = uVar38;
        auVar50._0_4_ = uVar38;
        auVar50._8_4_ = uVar38;
        auVar50._12_4_ = uVar38;
        auVar49 = pshuflw(ZEXT416((uint)_s1Len),ZEXT416((uint)_s1Len),0);
        uVar38 = auVar49._0_4_;
        auVar44._4_4_ = uVar38;
        auVar44._0_4_ = uVar38;
        auVar44._8_4_ = uVar38;
        auVar44._12_4_ = uVar38;
        auVar45._8_4_ = 0xffffffff;
        auVar45._0_8_ = 0xffffffffffffffff;
        auVar45._12_4_ = 0xffffffff;
        auVar49 = paddsw(auVar44,auVar45);
        auVar44 = pshuflw(ZEXT416((uint)s2Len),ZEXT416((uint)s2Len),0);
        auVar61._0_4_ = auVar44._0_4_;
        auVar61._4_4_ = auVar61._0_4_;
        auVar61._8_4_ = auVar61._0_4_;
        auVar61._12_4_ = auVar61._0_4_;
        auVar45 = paddsw(auVar61,auVar45);
        local_158._10_2_ = sVar21 + sVar11 * -2;
        local_158._8_2_ = sVar11 * -3 - sVar4;
        local_158._12_2_ = sVar21 - sVar11;
        local_158._14_2_ = sVar21;
        local_158._0_8_ =
             (ulong)(uint)(gap * 0xfff9 - open) & 0xffffffff0000ffff |
             (ulong)(ushort)(sVar11 * -6 - sVar4) << 0x10 |
             (ulong)(ushort)(sVar11 * -5 - sVar4) << 0x20 |
             (ulong)(ushort)(sVar21 + sVar11 * -4) << 0x30;
        auVar44 = psllw(auVar50,3);
        piVar2 = matrix->mapper;
        uVar36 = (ulong)(uint)s2Len;
        uVar24 = 0;
        do {
          ptr[uVar24 + 7] = (int16_t)piVar2[(byte)_s2[uVar24]];
          uVar24 = uVar24 + 1;
        } while (uVar36 != uVar24);
        uVar24 = 0;
        ptr[3] = 0;
        ptr[4] = 0;
        ptr[5] = 0;
        ptr[6] = 0;
        ptr[0] = 0;
        ptr[1] = 0;
        ptr[2] = 0;
        ptr[3] = 0;
        uVar16 = s2Len + 1U;
        if ((int)(s2Len + 1U) < (int)uVar28) {
          uVar16 = uVar28;
        }
        memset(ptr + uVar36 + 7,0,(ulong)(~s2Len + uVar16) * 2 + 2);
        do {
          ptr_00[uVar24 + 7] = (int16_t)iVar26;
          iVar26 = iVar26 - gap;
          iVar25 = (int16_t)uVar30;
          ptr_01[uVar24 + 7] = iVar25;
          uVar24 = uVar24 + 1;
        } while (uVar36 != uVar24);
        lVar20 = 0;
        do {
          ptr_00[lVar20] = iVar25;
          ptr_01[lVar20] = iVar25;
          lVar20 = lVar20 + 1;
        } while (lVar20 != 7);
        lVar20 = uVar36 + 7;
        do {
          ptr_00[lVar20] = iVar25;
          ptr_01[lVar20] = iVar25;
          lVar20 = lVar20 + 1;
          s2Len = s2Len + 1;
        } while (s2Len < (int)uVar28);
        ptr_00[6] = 0;
        local_f8 = auVar39._0_2_;
        uStack_f6 = auVar39._2_2_;
        uVar52 = local_f8;
        uVar53 = uStack_f6;
        uVar54 = local_f8;
        uVar55 = uStack_f6;
        uVar56 = local_f8;
        uVar57 = uStack_f6;
        uVar58 = local_f8;
        uVar59 = uStack_f6;
        if (_s1Len < 1) {
          auVar39._4_2_ = local_198;
          auVar39._0_4_ = uVar48;
          auVar39._6_2_ = sStack_196;
          auVar39._8_2_ = local_198;
          auVar39._10_2_ = sStack_196;
          auVar39._12_2_ = local_198;
          auVar39._14_2_ = sStack_196;
          auVar60 = auVar39;
        }
        else {
          piVar2 = matrix->matrix;
          Var13 = CONCAT28(local_198,CONCAT26(sStack_196,CONCAT24(local_198,uVar48)));
          auVar12._10_2_ = sStack_196;
          auVar12._0_10_ = Var13;
          auVar12._12_2_ = local_198;
          auVar12._14_2_ = sStack_196;
          uVar24 = 1;
          if (1 < (int)uVar28) {
            uVar24 = (ulong)uVar28;
          }
          uVar27 = (ulong)(uint)_s1Len;
          local_108 = uVar36 * 0x1c + -0x1c;
          lVar20 = uVar36 * 0x20;
          local_110 = uVar36 * 4 + -4;
          local_120 = uVar36 * 0x18 + -0x18;
          local_128 = uVar36 * 0x14 + -0x14;
          local_130 = uVar36 * 8 + -8;
          local_138 = uVar36 * 0x10 + -0x10;
          local_140 = uVar36 * 0xc + -0xc;
          auVar61 = pmovsxbw(in_XMM5,0x1020304050607);
          local_118 = 0;
          auVar62 = pmovsxbw(in_XMM8,0x101010101010101);
          auVar14._4_4_ = uVar37;
          auVar14._0_4_ = uVar37;
          auVar14._8_4_ = uVar37;
          auVar14._12_4_ = uVar37;
          uVar35 = 0;
          auVar39 = auVar12;
          auVar60 = auVar12;
          do {
            if (matrix->type == 0) {
              uVar28 = (uint)ptr_02[uVar35];
              uVar22 = (uint)ptr_02[uVar35 + 1];
              uVar17 = (uint)ptr_02[uVar35 + 2];
              uVar32 = (uint)ptr_02[uVar35 + 3];
              uVar31 = (uint)ptr_02[uVar35 + 4];
              uVar34 = (uint)ptr_02[uVar35 + 5];
              uVar33 = (uint)ptr_02[uVar35 + 6];
              uVar16 = (int)ptr_02[uVar35 + 7];
            }
            else {
              uVar28 = (uint)uVar35;
              uVar22 = uVar28 | 1;
              if (uVar27 <= (uVar35 | 1)) {
                uVar22 = local_1b0;
              }
              uVar17 = uVar28 | 2;
              if (uVar27 <= (uVar35 | 2)) {
                uVar17 = local_1b0;
              }
              uVar32 = uVar28 | 3;
              if (uVar27 <= (uVar35 | 3)) {
                uVar32 = local_1b0;
              }
              uVar31 = uVar28 | 4;
              if (uVar27 <= (uVar35 | 4)) {
                uVar31 = local_1b0;
              }
              uVar34 = uVar28 | 5;
              if (uVar27 <= (uVar35 | 5)) {
                uVar34 = local_1b0;
              }
              uVar33 = uVar28 | 6;
              if (uVar27 <= (uVar35 | 6)) {
                uVar33 = local_1b0;
              }
              uVar16 = uVar28 | 7;
              if (uVar27 <= (uVar35 | 7)) {
                uVar16 = local_1b0;
              }
            }
            iVar18 = matrix->size;
            uVar1 = uVar35 + 8;
            local_98 = (undefined8)((unkuint10)Var13 >> 0x10);
            uStack_90 = auVar12._8_8_ >> 0x10;
            auVar77._8_8_ = uStack_90 | (ulong)(ushort)ptr_00[6] << 0x30;
            auVar77._0_8_ = local_98;
            auVar66._8_8_ = uStack_90 | (ulong)(ushort)(sVar21 - (short)uVar35 * sVar11) << 0x30;
            auVar66._0_8_ = local_98;
            ptr_00[6] = sVar21 - (short)uVar1 * sVar11;
            local_78 = auVar49._0_2_;
            sStack_76 = auVar49._2_2_;
            sStack_74 = auVar49._4_2_;
            sStack_72 = auVar49._6_2_;
            sStack_70 = auVar49._8_2_;
            sStack_6e = auVar49._10_2_;
            sStack_6c = auVar49._12_2_;
            sStack_6a = auVar49._14_2_;
            auVar74._0_2_ = -(ushort)(auVar61._0_2_ == local_78);
            auVar74._2_2_ = -(ushort)(auVar61._2_2_ == sStack_76);
            auVar74._4_2_ = -(ushort)(auVar61._4_2_ == sStack_74);
            auVar74._6_2_ = -(ushort)(auVar61._6_2_ == sStack_72);
            auVar74._8_2_ = -(ushort)(auVar61._8_2_ == sStack_70);
            auVar74._10_2_ = -(ushort)(auVar61._10_2_ == sStack_6e);
            auVar74._12_2_ = -(ushort)(auVar61._12_2_ == sStack_6c);
            auVar74._14_2_ = -(ushort)(auVar61._14_2_ == sStack_6a);
            in_XMM13 = pmovsxbw(in_XMM13,0xfffefdfcfbfaf9);
            auVar63._4_2_ = local_198;
            auVar63._0_4_ = uVar48;
            auVar63._6_2_ = sStack_196;
            auVar63._8_2_ = local_198;
            auVar63._10_2_ = sStack_196;
            auVar63._12_2_ = local_198;
            auVar63._14_2_ = sStack_196;
            uVar29 = 0;
            auVar42 = auVar39;
            auVar81 = auVar63;
            do {
              auVar40._10_2_ = (short)piVar2[(long)(int)(uVar17 * iVar18) + (long)ptr[uVar29 + 5]];
              auVar40._8_2_ = (short)piVar2[(long)(int)(uVar32 * iVar18) + (long)ptr[uVar29 + 4]];
              auVar40._12_2_ = (short)piVar2[(long)(int)(uVar22 * iVar18) + (long)ptr[uVar29 + 6]];
              auVar40._14_2_ = (short)piVar2[(long)(int)(uVar28 * iVar18) + (long)ptr[uVar29 + 7]];
              auVar40._0_8_ =
                   (ulong)(uint)piVar2[(long)(int)(uVar16 * iVar18) + (long)ptr[uVar29]] &
                   0xffffffff0000ffff |
                   (ulong)*(ushort *)(piVar2 + (long)(int)(uVar33 * iVar18) + (long)ptr[uVar29 + 1])
                   << 0x10 | (ulong)*(ushort *)
                                     (piVar2 + (long)(int)(uVar34 * iVar18) + (long)ptr[uVar29 + 2])
                             << 0x20 |
                   (ulong)*(ushort *)(piVar2 + (long)(int)(uVar31 * iVar18) + (long)ptr[uVar29 + 3])
                   << 0x30;
              auVar51._0_8_ = auVar66._2_8_;
              auVar51._8_8_ = auVar66._8_8_ >> 0x10 | (ulong)(ushort)ptr_00[uVar29 + 7] << 0x30;
              auVar76._0_8_ = auVar63._2_8_;
              auVar76._8_8_ = auVar63._8_8_ >> 0x10 | (ulong)(ushort)ptr_01[uVar29 + 7] << 0x30;
              auVar39 = paddsw(auVar40,auVar77);
              auVar63 = psubsw(auVar51,auVar14);
              auVar77 = psubsw(auVar76,auVar50);
              sVar4 = auVar63._0_2_;
              sVar75 = auVar77._0_2_;
              auVar78._0_2_ = (ushort)(sVar75 < sVar4) * sVar4 | (ushort)(sVar75 >= sVar4) * sVar75;
              sVar4 = auVar63._2_2_;
              sVar75 = auVar77._2_2_;
              auVar78._2_2_ = (ushort)(sVar75 < sVar4) * sVar4 | (ushort)(sVar75 >= sVar4) * sVar75;
              sVar4 = auVar63._4_2_;
              sVar75 = auVar77._4_2_;
              auVar78._4_2_ = (ushort)(sVar75 < sVar4) * sVar4 | (ushort)(sVar75 >= sVar4) * sVar75;
              sVar4 = auVar63._6_2_;
              sVar75 = auVar77._6_2_;
              auVar78._6_2_ = (ushort)(sVar75 < sVar4) * sVar4 | (ushort)(sVar75 >= sVar4) * sVar75;
              sVar4 = auVar63._8_2_;
              sVar75 = auVar77._8_2_;
              auVar78._8_2_ = (ushort)(sVar75 < sVar4) * sVar4 | (ushort)(sVar75 >= sVar4) * sVar75;
              sVar4 = auVar63._10_2_;
              sVar75 = auVar77._10_2_;
              auVar78._10_2_ = (ushort)(sVar75 < sVar4) * sVar4 | (ushort)(sVar75 >= sVar4) * sVar75
              ;
              sVar4 = auVar63._12_2_;
              sVar75 = auVar77._12_2_;
              sVar79 = auVar77._14_2_;
              auVar78._12_2_ = (ushort)(sVar75 < sVar4) * sVar4 | (ushort)(sVar75 >= sVar4) * sVar75
              ;
              sVar4 = auVar63._14_2_;
              auVar78._14_2_ = (ushort)(sVar79 < sVar4) * sVar4 | (ushort)(sVar79 >= sVar4) * sVar79
              ;
              auVar63 = psubsw(auVar66,auVar14);
              auVar77 = psubsw(auVar81,auVar50);
              sVar4 = auVar63._0_2_;
              sVar75 = auVar77._0_2_;
              auVar80._0_2_ = (ushort)(sVar75 < sVar4) * sVar4 | (ushort)(sVar75 >= sVar4) * sVar75;
              sVar4 = auVar63._2_2_;
              sVar75 = auVar77._2_2_;
              auVar80._2_2_ = (ushort)(sVar75 < sVar4) * sVar4 | (ushort)(sVar75 >= sVar4) * sVar75;
              sVar4 = auVar63._4_2_;
              sVar75 = auVar77._4_2_;
              auVar80._4_2_ = (ushort)(sVar75 < sVar4) * sVar4 | (ushort)(sVar75 >= sVar4) * sVar75;
              sVar4 = auVar63._6_2_;
              sVar75 = auVar77._6_2_;
              auVar80._6_2_ = (ushort)(sVar75 < sVar4) * sVar4 | (ushort)(sVar75 >= sVar4) * sVar75;
              sVar4 = auVar63._8_2_;
              sVar75 = auVar77._8_2_;
              auVar80._8_2_ = (ushort)(sVar75 < sVar4) * sVar4 | (ushort)(sVar75 >= sVar4) * sVar75;
              sVar4 = auVar63._10_2_;
              sVar75 = auVar77._10_2_;
              auVar80._10_2_ = (ushort)(sVar75 < sVar4) * sVar4 | (ushort)(sVar75 >= sVar4) * sVar75
              ;
              sVar4 = auVar63._12_2_;
              sVar75 = auVar77._12_2_;
              sVar79 = auVar77._14_2_;
              auVar80._12_2_ = (ushort)(sVar75 < sVar4) * sVar4 | (ushort)(sVar75 >= sVar4) * sVar75
              ;
              sVar4 = auVar63._14_2_;
              auVar80._14_2_ = (ushort)(sVar79 < sVar4) * sVar4 | (ushort)(sVar79 >= sVar4) * sVar79
              ;
              uVar64 = ((short)auVar80._0_2_ < (short)auVar78._0_2_) * auVar78._0_2_ |
                       ((short)auVar80._0_2_ >= (short)auVar78._0_2_) * auVar80._0_2_;
              uVar67 = ((short)auVar80._2_2_ < (short)auVar78._2_2_) * auVar78._2_2_ |
                       ((short)auVar80._2_2_ >= (short)auVar78._2_2_) * auVar80._2_2_;
              uVar68 = ((short)auVar80._4_2_ < (short)auVar78._4_2_) * auVar78._4_2_ |
                       ((short)auVar80._4_2_ >= (short)auVar78._4_2_) * auVar80._4_2_;
              uVar69 = ((short)auVar80._6_2_ < (short)auVar78._6_2_) * auVar78._6_2_ |
                       ((short)auVar80._6_2_ >= (short)auVar78._6_2_) * auVar80._6_2_;
              uVar70 = ((short)auVar80._8_2_ < (short)auVar78._8_2_) * auVar78._8_2_ |
                       ((short)auVar80._8_2_ >= (short)auVar78._8_2_) * auVar80._8_2_;
              uVar71 = ((short)auVar80._10_2_ < (short)auVar78._10_2_) * auVar78._10_2_ |
                       ((short)auVar80._10_2_ >= (short)auVar78._10_2_) * auVar80._10_2_;
              uVar72 = ((short)auVar80._12_2_ < (short)auVar78._12_2_) * auVar78._12_2_ |
                       ((short)auVar80._12_2_ >= (short)auVar78._12_2_) * auVar80._12_2_;
              uVar73 = ((short)auVar80._14_2_ < (short)auVar78._14_2_) * auVar78._14_2_ |
                       ((short)auVar80._14_2_ >= (short)auVar78._14_2_) * auVar80._14_2_;
              sVar4 = auVar39._0_2_;
              auVar65._0_2_ =
                   (ushort)((short)uVar64 < sVar4) * sVar4 | ((short)uVar64 >= sVar4) * uVar64;
              sVar4 = auVar39._2_2_;
              auVar65._2_2_ =
                   (ushort)((short)uVar67 < sVar4) * sVar4 | ((short)uVar67 >= sVar4) * uVar67;
              sVar4 = auVar39._4_2_;
              auVar65._4_2_ =
                   (ushort)((short)uVar68 < sVar4) * sVar4 | ((short)uVar68 >= sVar4) * uVar68;
              sVar4 = auVar39._6_2_;
              auVar65._6_2_ =
                   (ushort)((short)uVar69 < sVar4) * sVar4 | ((short)uVar69 >= sVar4) * uVar69;
              sVar4 = auVar39._8_2_;
              auVar65._8_2_ =
                   (ushort)((short)uVar70 < sVar4) * sVar4 | ((short)uVar70 >= sVar4) * uVar70;
              sVar4 = auVar39._10_2_;
              auVar65._10_2_ =
                   (ushort)((short)uVar71 < sVar4) * sVar4 | ((short)uVar71 >= sVar4) * uVar71;
              sVar4 = auVar39._12_2_;
              auVar65._12_2_ =
                   (ushort)((short)uVar72 < sVar4) * sVar4 | ((short)uVar72 >= sVar4) * uVar72;
              sVar4 = auVar39._14_2_;
              auVar65._14_2_ =
                   (ushort)((short)uVar73 < sVar4) * sVar4 | ((short)uVar73 >= sVar4) * uVar73;
              auVar41._0_2_ = -(ushort)(in_XMM13._0_2_ == -1);
              auVar41._2_2_ = -(ushort)(in_XMM13._2_2_ == -1);
              auVar41._4_2_ = -(ushort)(in_XMM13._4_2_ == -1);
              auVar41._6_2_ = -(ushort)(in_XMM13._6_2_ == -1);
              auVar41._8_2_ = -(ushort)(in_XMM13._8_2_ == -1);
              auVar41._10_2_ = -(ushort)(in_XMM13._10_2_ == -1);
              auVar41._12_2_ = -(ushort)(in_XMM13._12_2_ == -1);
              auVar41._14_2_ = -(ushort)(in_XMM13._14_2_ == -1);
              auVar66 = pblendvb(auVar65,local_158,auVar41);
              auVar81._4_2_ = local_198;
              auVar81._0_4_ = uVar48;
              auVar81._6_2_ = sStack_196;
              auVar81._8_2_ = local_198;
              auVar81._10_2_ = sStack_196;
              auVar81._12_2_ = local_198;
              auVar81._14_2_ = sStack_196;
              auVar63 = pblendvb(auVar78,auVar81,auVar41);
              auVar81 = pblendvb(auVar80,auVar81,auVar41);
              sVar4 = auVar66._0_2_;
              sVar75 = auVar66._2_2_;
              sVar79 = auVar66._4_2_;
              sVar5 = auVar66._6_2_;
              sVar6 = auVar66._8_2_;
              sVar7 = auVar66._10_2_;
              sVar8 = auVar66._12_2_;
              sVar9 = auVar66._14_2_;
              auVar39 = auVar42;
              if (7 < uVar29) {
                uVar52 = (ushort)(sVar4 < (short)uVar52) * sVar4 | (sVar4 >= (short)uVar52) * uVar52
                ;
                uVar53 = (ushort)(sVar75 < (short)uVar53) * sVar75 |
                         (sVar75 >= (short)uVar53) * uVar53;
                uVar54 = (ushort)(sVar79 < (short)uVar54) * sVar79 |
                         (sVar79 >= (short)uVar54) * uVar54;
                uVar55 = (ushort)(sVar5 < (short)uVar55) * sVar5 | (sVar5 >= (short)uVar55) * uVar55
                ;
                uVar56 = (ushort)(sVar6 < (short)uVar56) * sVar6 | (sVar6 >= (short)uVar56) * uVar56
                ;
                uVar57 = (ushort)(sVar7 < (short)uVar57) * sVar7 | (sVar7 >= (short)uVar57) * uVar57
                ;
                uVar58 = (ushort)(sVar8 < (short)uVar58) * sVar8 | (sVar8 >= (short)uVar58) * uVar58
                ;
                uVar59 = (ushort)(sVar9 < (short)uVar59) * sVar9 | (sVar9 >= (short)uVar59) * uVar59
                ;
                sVar43 = auVar42._0_2_;
                auVar39._0_2_ =
                     (ushort)(sVar43 < sVar4) * sVar4 | (ushort)(sVar43 >= sVar4) * sVar43;
                sVar43 = auVar42._2_2_;
                auVar39._2_2_ =
                     (ushort)(sVar43 < sVar75) * sVar75 | (ushort)(sVar43 >= sVar75) * sVar43;
                sVar43 = auVar42._4_2_;
                auVar39._4_2_ =
                     (ushort)(sVar43 < sVar79) * sVar79 | (ushort)(sVar43 >= sVar79) * sVar43;
                sVar43 = auVar42._6_2_;
                auVar39._6_2_ =
                     (ushort)(sVar43 < sVar5) * sVar5 | (ushort)(sVar43 >= sVar5) * sVar43;
                sVar43 = auVar42._8_2_;
                auVar39._8_2_ =
                     (ushort)(sVar43 < sVar6) * sVar6 | (ushort)(sVar43 >= sVar6) * sVar43;
                sVar43 = auVar42._10_2_;
                auVar39._10_2_ =
                     (ushort)(sVar43 < sVar7) * sVar7 | (ushort)(sVar43 >= sVar7) * sVar43;
                sVar43 = auVar42._12_2_;
                sVar47 = auVar42._14_2_;
                auVar39._12_2_ =
                     (ushort)(sVar43 < sVar8) * sVar8 | (ushort)(sVar43 >= sVar8) * sVar43;
                auVar39._14_2_ =
                     (ushort)(sVar47 < sVar9) * sVar9 | (ushort)(sVar47 >= sVar9) * sVar47;
              }
              piVar3 = ((ppVar19->field_4).rowcols)->score_row;
              if (uVar29 < uVar36) {
                *(int *)((long)piVar3 + uVar29 * 4 + local_118) = (int)sVar9;
              }
              if (uVar29 - 1 < uVar36 && (uVar35 | 1) < uVar27) {
                *(int *)((long)piVar3 + uVar29 * 4 + local_110) = (int)sVar8;
              }
              if (((uVar35 | 2) < uVar27) && ((long)(uVar29 - 2) < (long)uVar36 && 1 < uVar29)) {
                *(int *)((long)piVar3 + uVar29 * 4 + local_130) = (int)sVar7;
              }
              if (((uVar35 | 3) < uVar27) && ((long)(uVar29 - 3) < (long)uVar36 && 2 < uVar29)) {
                *(int *)((long)piVar3 + uVar29 * 4 + local_140) = (int)sVar6;
              }
              if (((uVar35 | 4) < uVar27) && ((long)(uVar29 - 4) < (long)uVar36 && 3 < uVar29)) {
                *(int *)((long)piVar3 + uVar29 * 4 + local_138) = (int)sVar5;
              }
              if (((uVar35 | 5) < uVar27) && ((long)(uVar29 - 5) < (long)uVar36 && 4 < uVar29)) {
                *(int *)((long)piVar3 + uVar29 * 4 + local_128) = (int)sVar79;
              }
              if (((uVar35 | 6) < uVar27) && ((long)(uVar29 - 6) < (long)uVar36 && 5 < uVar29)) {
                *(int *)((long)piVar3 + uVar29 * 4 + local_120) = (int)sVar75;
              }
              if (6 < uVar29 && (uVar35 | 7) < uVar27) {
                *(int *)((long)piVar3 + uVar29 * 4 + local_108) = (int)sVar4;
              }
              ptr_00[uVar29] = sVar4;
              ptr_01[uVar29] = auVar63._0_2_;
              local_68 = auVar45._0_2_;
              sStack_66 = auVar45._2_2_;
              sStack_64 = auVar45._4_2_;
              sStack_62 = auVar45._6_2_;
              sStack_60 = auVar45._8_2_;
              sStack_5e = auVar45._10_2_;
              sStack_5c = auVar45._12_2_;
              sStack_5a = auVar45._14_2_;
              auVar42._0_2_ = -(ushort)(in_XMM13._0_2_ == local_68);
              auVar42._2_2_ = -(ushort)(in_XMM13._2_2_ == sStack_66);
              auVar42._4_2_ = -(ushort)(in_XMM13._4_2_ == sStack_64);
              auVar42._6_2_ = -(ushort)(in_XMM13._6_2_ == sStack_62);
              auVar42._8_2_ = -(ushort)(in_XMM13._8_2_ == sStack_60);
              auVar42._10_2_ = -(ushort)(in_XMM13._10_2_ == sStack_5e);
              auVar42._12_2_ = -(ushort)(in_XMM13._12_2_ == sStack_5c);
              auVar42._14_2_ = -(ushort)(in_XMM13._14_2_ == sStack_5a);
              auVar60 = pblendvb(auVar60,auVar66,auVar42 & auVar74);
              in_XMM13 = paddsw(in_XMM13,auVar62);
              uVar29 = uVar29 + 1;
              auVar42 = auVar39;
              auVar77 = auVar51;
            } while (uVar24 != uVar29);
            auVar61 = paddsw(auVar61,_DAT_00904d20);
            local_158 = psubsw(local_158,auVar44);
            local_108 = local_108 + lVar20;
            local_118 = local_118 + lVar20;
            local_110 = local_110 + lVar20;
            local_120 = local_120 + lVar20;
            local_128 = local_128 + lVar20;
            local_138 = local_138 + lVar20;
            local_140 = local_140 + lVar20;
            local_130 = local_130 + lVar20;
            uVar35 = uVar1;
          } while (uVar1 < uVar27);
        }
        iVar18 = 8;
        do {
          uVar24 = auVar60._0_8_;
          lVar20 = auVar60._8_8_;
          uVar28 = (uint)auVar60._14_2_;
          if ((short)auVar60._14_2_ <= (short)uVar30) {
            uVar28 = uVar30;
          }
          uVar30 = uVar28;
          sVar21 = (short)uVar30;
          auVar60._0_8_ = uVar24 << 0x10;
          auVar60._8_8_ = lVar20 << 0x10 | uVar24 >> 0x30;
          iVar18 = iVar18 + -1;
        } while (iVar18 != 0);
        auVar62._0_2_ = -(ushort)((short)uVar52 < local_198);
        auVar62._2_2_ = -(ushort)((short)uVar53 < sStack_196);
        auVar62._4_2_ = -(ushort)((short)uVar54 < local_198);
        auVar62._6_2_ = -(ushort)((short)uVar55 < sStack_196);
        auVar62._8_2_ = -(ushort)((short)uVar56 < local_198);
        auVar62._10_2_ = -(ushort)((short)uVar57 < sStack_196);
        auVar62._12_2_ = -(ushort)((short)uVar58 < local_198);
        auVar62._14_2_ = -(ushort)((short)uVar59 < sStack_196);
        auVar46._0_2_ = -(ushort)((short)local_f8 < auVar39._0_2_);
        auVar46._2_2_ = -(ushort)((short)uStack_f6 < auVar39._2_2_);
        auVar46._4_2_ = -(ushort)((short)local_f8 < auVar39._4_2_);
        auVar46._6_2_ = -(ushort)((short)uStack_f6 < auVar39._6_2_);
        auVar46._8_2_ = -(ushort)((short)local_f8 < auVar39._8_2_);
        auVar46._10_2_ = -(ushort)((short)uStack_f6 < auVar39._10_2_);
        auVar46._12_2_ = -(ushort)((short)local_f8 < auVar39._12_2_);
        auVar46._14_2_ = -(ushort)((short)uStack_f6 < auVar39._14_2_);
        auVar46 = auVar46 | auVar62;
        if ((((((((((((((((auVar46 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar46 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar46 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar46 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar46 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar46 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar46 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar46 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar46 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar46 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar46 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar46 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar46 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar46 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar46 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar46[0xf] < '\0') {
          *(byte *)&ppVar19->flag = (byte)ppVar19->flag | 0x40;
          sVar21 = 0;
          iVar23 = 0;
          local_1b0 = 0;
        }
        ppVar19->score = (int)sVar21;
        ppVar19->end_query = local_1b0;
        ppVar19->end_ref = iVar23;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(ptr_02);
          return ppVar19;
        }
        return ppVar19;
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMax;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 8; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi16(NEG_LIMIT);
    vOpen = _mm_set1_epi16(open);
    vGap  = _mm_set1_epi16(gap);
    vOne = _mm_set1_epi16(1);
    vN = _mm_set1_epi16(N);
    vGapN = _mm_set1_epi16(gap*N);
    vNegOne = _mm_set1_epi16(-1);
    vI = _mm_set_epi16(0,1,2,3,4,5,6,7);
    vJreset = _mm_set_epi16(0,-1,-2,-3,-4,-5,-6,-7);
    vMax = vNegInf;
    vILimit = _mm_set1_epi16(s1Len);
    vILimit1 = _mm_subs_epi16(vILimit, vOne);
    vJLimit = _mm_set1_epi16(s2Len);
    vJLimit1 = _mm_subs_epi16(vJLimit, vOne);
    vIBoundary = _mm_set_epi16(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap,
            -open-4*gap,
            -open-5*gap,
            -open-6*gap,
            -open-7*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int16_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int16_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        vNH = _mm_srli_si128(vNH, 2);
        vNH = _mm_insert_epi16(vNH, H_pr[-1], 7);
        vWH = _mm_srli_si128(vWH, 2);
        vWH = _mm_insert_epi16(vWH, -open - i*gap, 7);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 2);
            vNH = _mm_insert_epi16(vNH, H_pr[j], 7);
            vF = _mm_srli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, F_pr[j], 7);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vNH, vOpen),
                    _mm_subs_epi16(vF, vGap));
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vWH, vOpen),
                    _mm_subs_epi16(vE, vGap));
            vMat = _mm_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]]
                    );
            vNWH = _mm_adds_epi16(vNWH, vMat);
            vWH = _mm_max_epi16(vNWH, vE);
            vWH = _mm_max_epi16(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm_blendv_epi8(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8(vF, vNegInf, cond);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-7] = (int16_t)_mm_extract_epi16(vWH,0);
            F_pr[j-7] = (int16_t)_mm_extract_epi16(vF,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m128i cond_valid_I = _mm_cmpeq_epi16(vI, vILimit1);
                __m128i cond_valid_J = _mm_cmpeq_epi16(vJ, vJLimit1);
                __m128i cond_all = _mm_and_si128(cond_valid_I, cond_valid_J);
                vMax = _mm_blendv_epi8(vMax, vWH, cond_all);
            }
            vJ = _mm_adds_epi16(vJ, vOne);
        }
        vI = _mm_adds_epi16(vI, vN);
        vIBoundary = _mm_subs_epi16(vIBoundary, vGapN);
    }

    /* max in vMax */
    for (i=0; i<N; ++i) {
        int16_t value;
        value = (int16_t) _mm_extract_epi16(vMax, 7);
        if (value > score) {
            score = value;
        }
        vMax = _mm_slli_si128(vMax, 2);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}